

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O0

void testTinySVD_3x3<float>(Matrix33<float> *A)

{
  float fVar1;
  bool bVar2;
  ostream *this;
  float *pfVar3;
  ostream *poVar4;
  ostream *poVar5;
  ostream *poVar6;
  Matrix33<float> *in_RDI;
  Matrix33<float> *in_stack_00000030;
  int j;
  int i;
  Matrix33<float> B;
  int cols [3];
  int local_64;
  int local_60;
  Matrix33<float> local_5c;
  int local_38 [12];
  Matrix33<float> *local_8;
  
  local_8 = in_RDI;
  this = std::operator<<((ostream *)&std::cout,"Verifying SVD for [[");
  pfVar3 = Imath_2_5::Matrix33<float>::operator[](local_8,0);
  poVar4 = (ostream *)std::ostream::operator<<(this,*pfVar3);
  poVar4 = std::operator<<(poVar4,", ");
  pfVar3 = Imath_2_5::Matrix33<float>::operator[](local_8,0);
  poVar5 = (ostream *)std::ostream::operator<<(poVar4,pfVar3[1]);
  poVar5 = std::operator<<(poVar5,", ");
  pfVar3 = Imath_2_5::Matrix33<float>::operator[](local_8,0);
  poVar6 = (ostream *)std::ostream::operator<<(poVar5,pfVar3[2]);
  poVar6 = std::operator<<(poVar6,"], ");
  poVar6 = std::operator<<(poVar6,"[");
  pfVar3 = Imath_2_5::Matrix33<float>::operator[](local_8,1);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pfVar3);
  poVar6 = std::operator<<(poVar6,", ");
  pfVar3 = Imath_2_5::Matrix33<float>::operator[](local_8,1);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,pfVar3[1]);
  poVar6 = std::operator<<(poVar6,", ");
  pfVar3 = Imath_2_5::Matrix33<float>::operator[](local_8,1);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,pfVar3[2]);
  poVar6 = std::operator<<(poVar6,"], ");
  poVar6 = std::operator<<(poVar6,"[");
  pfVar3 = Imath_2_5::Matrix33<float>::operator[](local_8,2);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pfVar3);
  poVar6 = std::operator<<(poVar6,", ");
  pfVar3 = Imath_2_5::Matrix33<float>::operator[](local_8,2);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,pfVar3[1]);
  poVar6 = std::operator<<(poVar6,", ");
  pfVar3 = Imath_2_5::Matrix33<float>::operator[](local_8,2);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,pfVar3[2]);
  std::operator<<(poVar6,"]]\n");
  verifyTinySVD_3x3<float>(in_stack_00000030);
  Imath_2_5::Matrix33<float>::transposed((Matrix33<float> *)poVar4);
  verifyTinySVD_3x3<float>(in_stack_00000030);
  local_38[0] = 0;
  local_38[1] = 1;
  local_38[2] = 2;
  do {
    Imath_2_5::Matrix33<float>::Matrix33((Matrix33<float> *)this);
    for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
      for (local_64 = 0; local_64 < 3; local_64 = local_64 + 1) {
        pfVar3 = Imath_2_5::Matrix33<float>::operator[](local_8,local_60);
        fVar1 = pfVar3[local_38[local_64]];
        pfVar3 = Imath_2_5::Matrix33<float>::operator[](&local_5c,local_60);
        pfVar3[local_64] = fVar1;
      }
    }
    verifyTinySVD_3x3<float>(in_stack_00000030);
    bVar2 = std::next_permutation<int*>((int *)poVar5,(int *)poVar4);
  } while (bVar2);
  return;
}

Assistant:

void
testTinySVD_3x3 (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    std::cout << "Verifying SVD for [[" << A[0][0] << ", " << A[0][1] << ", " << A[0][2] << "], "
                                 << "[" << A[1][0] << ", " << A[1][1] << ", " << A[1][2] << "], "
                                 << "[" << A[2][0] << ", " << A[2][1] << ", " << A[2][2] << "]]\n";
 
    verifyTinySVD_3x3 (A);
    verifyTinySVD_3x3 (A.transposed());

    // Try all different orderings of the columns of A:
    int cols[3] = { 0, 1, 2 };
    do
    {
        IMATH_INTERNAL_NAMESPACE::Matrix33<T> B;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                B[i][j] = A[i][cols[j]];

        verifyTinySVD_3x3 (B);
    } while (std::next_permutation (cols, cols + 3));
}